

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase270::run(TestCase270 *this)

{
  Builder builder;
  AsyncOutputStream node;
  ArrayPtr<const_capnp::word> *pAVar1;
  Iface *pIVar2;
  long *plVar3;
  ElementCount index;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  Own<kj::AsyncOutputStream,_std::nullptr_t> output;
  PipeWithSmallBuffer fds;
  Thread thread;
  AsyncIoContext ioContext;
  Builder list;
  Builder root;
  TestMessageBuilder message;
  AsyncOutputStream local_218;
  undefined8 *local_210;
  ArrayPtr<const_capnp::word> *local_208;
  PipeWithSmallBuffer local_200;
  Function<void_()> local_1f8;
  StructBuilder local_1e8;
  undefined8 *local_1c0;
  long *local_1b8;
  undefined8 *local_1b0;
  long *local_1a8;
  void *local_1a0;
  char *local_190;
  undefined *puStackY_188;
  undefined8 local_180;
  ListBuilder local_178;
  SegmentBuilder *in_stack_fffffffffffffeb0;
  CapTableBuilder *in_stack_fffffffffffffeb8;
  void *in_stack_fffffffffffffec0;
  WirePointer *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  TestMessageBuilder local_128;
  
  PipeWithSmallBuffer::PipeWithSmallBuffer(&local_200);
  kj::setupAsyncIo();
  (**(code **)(*local_1b8 + 8))(&local_210,local_1b8,local_200.fds[1]);
  MallocMessageBuilder::MallocMessageBuilder(&local_128.super_MallocMessageBuilder,0,FIXED_SIZE);
  local_128.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_006e4460;
  local_128.desiredSegmentCount = 1;
  MessageBuilder::getRootInternal((Builder *)&local_1e8,(MessageBuilder *)&local_128);
  local_178.ptr = (byte *)local_1e8.data;
  local_178.segment = local_1e8.segment;
  local_178.capTable = local_1e8.capTable;
  PointerBuilder::getStruct
            ((StructBuilder *)&stack0xfffffffffffffeb0,(PointerBuilder *)&local_178,
             (StructSize)0x140006,(word *)0x0);
  local_1e8.data = in_stack_fffffffffffffec8 + 0x11;
  PointerBuilder::initStructList(&local_178,(PointerBuilder *)&local_1e8,0x10,(StructSize)0x140006);
  if (local_178.elementCount != 0) {
    index = 0;
    do {
      ListBuilder::getStructElement(&local_1e8,&local_178,index);
      builder._builder.capTable = in_stack_fffffffffffffeb8;
      builder._builder.segment = in_stack_fffffffffffffeb0;
      builder._builder.data = in_stack_fffffffffffffec0;
      builder._builder.pointers = in_stack_fffffffffffffec8;
      builder._builder.dataSize = (StructDataBitCount)in_stack_fffffffffffffed0;
      builder._builder.pointerCount = SUB82(in_stack_fffffffffffffed0,4);
      builder._builder._38_2_ = SUB82(in_stack_fffffffffffffed0,6);
      initTestMessage(builder);
      index = index + 1;
    } while (local_178.elementCount != index);
  }
  local_1f8.impl.ptr = (Iface *)operator_new(0x18);
  (local_1f8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___006e4668;
  local_1f8.impl.ptr[1]._vptr_Iface = (_func_int **)&local_200;
  local_1f8.impl.ptr[2]._vptr_Iface = (_func_int **)&local_178;
  local_1f8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void()>::Impl<capnp::_::(anonymous_namespace)::TestCase270::run()::$_0>>
        ::instance;
  kj::Thread::Thread((Thread *)&local_1e8,&local_1f8);
  pIVar2 = local_1f8.impl.ptr;
  if (local_1f8.impl.ptr != (Iface *)0x0) {
    local_1f8.impl.ptr = (Iface *)0x0;
    (**(local_1f8.impl.disposer)->_vptr_Disposer)
              (local_1f8.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pAVar1 = local_208;
  AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_128);
  AVar4.size_ = (size_t)AVar4.ptr;
  AVar4.ptr = pAVar1;
  writeMessage(&local_218,AVar4);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async-test.c++"
  ;
  puStackY_188 = &DAT_004fd5db;
  local_180 = 0x300000124;
  kj::Promise<void>::wait((Promise<void> *)&local_218,local_1a0);
  node._vptr_AsyncOutputStream = local_218._vptr_AsyncOutputStream;
  if ((PromiseArenaMember *)local_218._vptr_AsyncOutputStream != (PromiseArenaMember *)0x0) {
    local_218._vptr_AsyncOutputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node._vptr_AsyncOutputStream);
  }
  kj::Thread::~Thread((Thread *)&local_1e8);
  TestMessageBuilder::~TestMessageBuilder(&local_128);
  pAVar1 = local_208;
  if (local_208 != (ArrayPtr<const_capnp::word> *)0x0) {
    local_208 = (ArrayPtr<const_capnp::word> *)0x0;
    (**(code **)*local_210)(local_210,(long)&pAVar1->ptr + pAVar1->ptr[-2].content);
  }
  plVar3 = local_1a8;
  if (local_1a8 != (long *)0x0) {
    local_1a8 = (long *)0x0;
    (**(code **)*local_1b0)(local_1b0,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  plVar3 = local_1b8;
  if (local_1b8 != (long *)0x0) {
    local_1b8 = (long *)0x0;
    (**(code **)*local_1c0)(local_1c0,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  PipeWithSmallBuffer::~PipeWithSmallBuffer(&local_200);
  return;
}

Assistant:

TEST(SerializeAsyncTest, WriteAsync) {
  PipeWithSmallBuffer fds;
  auto ioContext = kj::setupAsyncIo();
  auto output = ioContext.lowLevelProvider->wrapOutputFd(fds[1]);

  TestMessageBuilder message(1);
  auto root = message.getRoot<TestAllTypes>();
  auto list = root.initStructList(16);
  for (auto element: list) {
    initTestMessage(element);
  }

  kj::Thread thread([&]() {
    SocketInputStream input(fds[0]);
    InputStreamMessageReader reader(input);
    auto listReader = reader.getRoot<TestAllTypes>().getStructList();
    EXPECT_EQ(list.size(), listReader.size());
    for (auto element: listReader) {
      checkTestMessage(element);
    }
  });

  writeMessage(*output, message).wait(ioContext.waitScope);
}